

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.hpp
# Opt level: O3

type_conflict2
InstructionSet::x86::
resolve<unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
          (Instruction<false> *instruction,Source source,DataPointer pointer,Context *context,
          unsigned_short *none,unsigned_short *immediate)

{
  uint16_t offset;
  type_conflict2 tVar1;
  uint32_t uVar2;
  ulong in_RAX;
  undefined7 in_register_00000031;
  undefined8 local_18;
  
  offset = 0;
  local_18 = in_RAX;
  switch(CONCAT71(in_register_00000031,source) & 0xffffffff) {
  case 0:
    tVar1 = (context->registers).ax_.full;
    break;
  case 1:
    tVar1 = (context->registers).cx_.full;
    break;
  case 2:
    tVar1 = (context->registers).dx_.full;
    break;
  case 3:
    tVar1 = (context->registers).bx_.full;
    break;
  case 4:
    tVar1 = (context->registers).sp_;
    break;
  case 5:
    tVar1 = (context->registers).bp_;
    break;
  case 6:
    tVar1 = (context->registers).si_;
    break;
  case 7:
    tVar1 = (context->registers).di_;
    break;
  case 8:
    tVar1 = (context->registers).es_;
    break;
  case 9:
    tVar1 = (context->registers).cs_;
    break;
  case 10:
    tVar1 = (context->registers).ss_;
    break;
  case 0xb:
    tVar1 = (context->registers).ds_;
    break;
  default:
    goto switchD_00390dfe_caseD_c;
  case 0xe:
    tVar1 = *none;
    break;
  case 0xf:
    local_18 = CONCAT26(*(undefined2 *)
                         ((long)instruction->extensions_ +
                         (ulong)(instruction->mem_exts_source_ >> 4 & 2)),(int6)in_RAX) &
               0xffff0000ffffffff;
    offset = *(uint16_t *)((long)&local_18 + (ulong)(instruction->mem_exts_source_ >> 5 & 2) + 4);
    goto switchD_00390dfe_caseD_c;
  case 0x10:
    local_18._4_4_ = (undefined4)(in_RAX >> 0x20);
    local_18 = (ulong)CONCAT42(local_18._4_4_,instruction->extensions_[0]) << 0x10;
    tVar1 = *(type_conflict2 *)((long)&local_18 + (ulong)(instruction->mem_exts_source_ >> 4 & 2));
    *immediate = tVar1;
    break;
  case 0x17:
    uVar2 = address<(InstructionSet::x86::Source)23,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                      (instruction,pointer,context);
    offset = (uint16_t)uVar2;
    goto switchD_00390dfe_caseD_c;
  case 0x18:
    uVar2 = address<(InstructionSet::x86::Source)24,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                      (instruction,pointer,context);
    offset = (uint16_t)uVar2;
switchD_00390dfe_caseD_c:
    tVar1 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
                      (&context->memory,(Source)(instruction->source_data_dest_sib_ >> 10) & BH | ES
                       ,offset);
    return tVar1;
  }
  return tVar1;
}

Assistant:

typename Accessor<IntT, access>::type resolve(
	InstructionT &instruction,
	Source source,
	DataPointer pointer,
	ContextT &context,
	IntT *none,
	IntT *immediate
) {
	// Rules:
	//
	// * if this is a memory access, set target_address and break;
	// * otherwise return the appropriate value.
	uint32_t target_address = 0;
	switch(source) {
		// Defer all register accesses to the register-specific lookup.
		case Source::eAX:		return *register_<IntT, access, Source::eAX>(context);
		case Source::eCX:		return *register_<IntT, access, Source::eCX>(context);
		case Source::eDX:		return *register_<IntT, access, Source::eDX>(context);
		case Source::eBX:		return *register_<IntT, access, Source::eBX>(context);
		case Source::eSPorAH:	return *register_<IntT, access, Source::eSPorAH>(context);
		case Source::eBPorCH:	return *register_<IntT, access, Source::eBPorCH>(context);
		case Source::eSIorDH:	return *register_<IntT, access, Source::eSIorDH>(context);
		case Source::eDIorBH:	return *register_<IntT, access, Source::eDIorBH>(context);
		case Source::ES:		return *register_<IntT, access, Source::ES>(context);
		case Source::CS:		return *register_<IntT, access, Source::CS>(context);
		case Source::SS:		return *register_<IntT, access, Source::SS>(context);
		case Source::DS:		return *register_<IntT, access, Source::DS>(context);
		case Source::FS:		return *register_<IntT, access, Source::FS>(context);
		case Source::GS:		return *register_<IntT, access, Source::GS>(context);

		case Source::None:		return *none;

		case Source::Immediate:
			*immediate = IntT(instruction.operand());
		return *immediate;

		case Source::Indirect:
			target_address = address<Source::Indirect, IntT, access>(instruction, pointer, context);
		break;
		case Source::IndirectNoBase:
			target_address = address<Source::IndirectNoBase, IntT, access>(instruction, pointer, context);
		break;
		case Source::DirectAddress:
			target_address = address<Source::DirectAddress, IntT, access>(instruction, pointer, context);
		break;
	}

	// If execution has reached here then a memory fetch is required.
	// Do it and exit.
	//
	// TODO: support 32-bit addresses.
	return context.memory.template access<IntT, access>(instruction.data_segment(), uint16_t(target_address));
}